

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

string * __thiscall
iqxmlrpc::http::Request_header::agent_abi_cxx11_
          (string *__return_storage_ptr__,Request_header *this)

{
  allocator<char> local_39;
  string local_38;
  Request_header *local_18;
  Request_header *this_local;
  
  local_18 = this;
  this_local = (Request_header *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"user-agent",&local_39);
  Header::get_string(__return_storage_ptr__,&this->super_Header,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string Request_header::agent() const
{
  return get_string(names::user_agent);
}